

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  Mem *pVal;
  double dVar4;
  int iVar5;
  uint uVar6;
  char *z2;
  void *pvVar7;
  sqlite3_int64 sVar8;
  sqlite3_int64 sVar9;
  byte *pbVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  byte *pbVar15;
  int *__s1;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  int local_cc;
  double local_c8;
  sqlite3_context *local_c0;
  int Y;
  undefined4 uStack_b4;
  char local_b0;
  int iStack_af;
  short local_ab;
  int M;
  undefined4 uStack_8c;
  double local_88;
  undefined8 uStack_80;
  sqlite3_value **local_78;
  ulong local_70;
  DateTime local_68;
  
  p->s = 0.0;
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->validJD = '\0';
  p->validTZ = '\0';
  *(undefined4 *)&p->field_0x2c = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  if (argc == 0) {
    iVar5 = sqlite3OsCurrentTimeInt64(((context->s).db)->pVfs,&p->iJD);
    if (iVar5 == 0) {
      p->validJD = '\x01';
      return 0;
    }
    return 1;
  }
  pVal = *argv;
  local_78 = argv;
  if (pVal->type - 1 < 2) {
    dVar4 = sqlite3VdbeRealValue(pVal);
    uVar19 = SUB84(dVar4,0);
    uVar20 = (undefined4)((ulong)dVar4 >> 0x20);
LAB_001a2fd2:
    p->iJD = (long)((double)CONCAT44(uVar20,uVar19) * 86400000.0 + 0.5);
    local_c0 = context;
  }
  else {
    pbVar10 = (byte *)sqlite3ValueText(pVal,'\x01');
    if (pbVar10 == (byte *)0x0) {
      return 1;
    }
    bVar2 = *pbVar10;
    uVar18 = (ulong)(bVar2 == 0x2d);
    local_c0 = context;
    iVar5 = getDigits((char *)(pbVar10 + uVar18),4,0,9999,0x2d,&Y,2,1,0xc,0x2d,&M,2,1,0x1f,0,
                      &local_cc);
    if (iVar5 == 3) {
      pbVar15 = pbVar10 + uVar18 + 9;
      do {
        do {
          pbVar1 = pbVar15 + 1;
          pbVar15 = pbVar15 + 1;
        } while ((ulong)*pbVar1 == 0x54);
      } while ((""[*pbVar1] & 1) != 0);
      iVar5 = parseHhMmSs((char *)pbVar15,p);
      if (iVar5 != 0) {
        if (*pbVar15 != 0) goto LAB_001a38a5;
        p->validHMS = '\0';
      }
      p->validJD = '\0';
      p->validYMD = '\x01';
      iVar5 = -Y;
      if (bVar2 != 0x2d) {
        iVar5 = Y;
      }
      p->Y = iVar5;
      p->M = M;
      p->D = local_cc;
      argv = local_78;
      if (p->validTZ != '\0') {
        computeJD(p);
        argv = local_78;
      }
      goto LAB_001a2fee;
    }
LAB_001a38a5:
    iVar5 = parseHhMmSs((char *)pbVar10,p);
    argv = local_78;
    context = local_c0;
    if (iVar5 == 0) goto LAB_001a2fee;
    bVar2 = *pbVar10;
    if (bVar2 == 0) {
      pcVar11 = "now";
    }
    else {
      pcVar11 = "now";
      pbVar15 = pbVar10;
      do {
        uVar18 = (ulong)bVar2;
        pbVar15 = pbVar15 + 1;
        if (""[uVar18] != ""[(byte)*pcVar11]) goto LAB_001a390e;
        pcVar11 = (char *)((byte *)pcVar11 + 1);
        bVar2 = *pbVar15;
      } while (bVar2 != 0);
    }
    uVar18 = 0;
LAB_001a390e:
    if (""[uVar18] != ""[(byte)*pcVar11]) {
      lVar14 = 0;
      do {
        lVar13 = lVar14;
        lVar14 = lVar13 + 1;
      } while (pbVar10[lVar13] != 0);
      iVar5 = sqlite3AtoF((char *)pbVar10,(double *)&local_68,(uint)lVar13 & 0x3fffffff,'\x01');
      if (iVar5 == 0) {
        return 1;
      }
      uVar19 = (undefined4)local_68.iJD;
      uVar20 = (undefined4)((ulong)local_68.iJD >> 0x20);
      goto LAB_001a2fd2;
    }
    iVar5 = sqlite3OsCurrentTimeInt64(((local_c0->s).db)->pVfs,&p->iJD);
    local_c0 = context;
    if (iVar5 != 0) {
      return 1;
    }
  }
  p->validJD = '\x01';
LAB_001a2fee:
  if (argc < 2) {
    return 0;
  }
  local_70 = (ulong)(uint)argc;
  uVar18 = 1;
  do {
    pvVar7 = sqlite3ValueText(argv[uVar18],'\x01');
    if (pvVar7 == (void *)0x0) {
      return 1;
    }
    local_cc = 1;
    uVar12 = 0;
    do {
      if ((ulong)*(byte *)((long)pvVar7 + uVar12) == 0) goto LAB_001a3058;
      *(uchar *)((long)&Y + uVar12) = ""[*(byte *)((long)pvVar7 + uVar12)];
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0x1d);
    uVar12 = 0x1d;
LAB_001a3058:
    *(undefined1 *)((long)&Y + (uVar12 & 0xffffffff)) = 0;
    uVar12 = (ulong)(byte)Y;
    uVar6 = Y & 0xff;
    if ((Y & 0xffU) < 0x6c) {
      if ((((Y & 0xffU) - 0x30 < 10) || (uVar6 == 0x2b)) || (uVar6 == 0x2d)) {
        lVar14 = 1;
        __s1 = &Y;
        while( true ) {
          bVar2 = *(byte *)((long)&Y + lVar14);
          if (((bVar2 == 0) || (bVar2 == 0x3a)) || ((""[bVar2] & 1) != 0)) break;
          lVar14 = lVar14 + 1;
          __s1 = (int *)((long)__s1 + 1);
        }
        iVar5 = sqlite3AtoF((char *)&Y,(double *)&M,(int)lVar14,'\x01');
        if (iVar5 == 0) {
          return 1;
        }
        if (bVar2 == 0x3a) {
          local_68.s = 0.0;
          local_68.validYMD = '\0';
          local_68.validHMS = '\0';
          local_68.validJD = '\0';
          local_68.validTZ = '\0';
          local_68._44_4_ = 0;
          local_68.D = 0;
          local_68.h = 0;
          local_68.m = 0;
          local_68.tz = 0;
          local_68.iJD = 0;
          local_68.Y = 0;
          local_68.M = 0;
          iVar5 = parseHhMmSs((char *)((long)&Y + (ulong)(uVar12 - 0x3a < 0xfffffffffffffff6)),
                              &local_68);
          if (iVar5 == 0) {
            computeJD(&local_68);
            lVar13 = (local_68.iJD + -43200000) % 86400000;
            lVar14 = -lVar13;
            if ((byte)Y != '-') {
              lVar14 = lVar13;
            }
            computeJD(p);
            p->validYMD = '\0';
            p->validHMS = '\0';
            p->validTZ = '\0';
            p->iJD = p->iJD + lVar14;
            local_cc = 0;
          }
          goto LAB_001a3798;
        }
        do {
          pbVar10 = (byte *)((long)__s1 + 1);
          __s1 = (int *)((long)__s1 + 1);
        } while ((""[*pbVar10] & 1) != 0);
        uVar6 = 0x3fffffff;
        lVar14 = 0;
        do {
          lVar13 = lVar14;
          uVar6 = uVar6 + 1;
          lVar14 = lVar13 + 1;
        } while (*(char *)((long)__s1 + lVar13) != '\0');
        uVar16 = (uint)lVar13 & 0x3fffffff;
        if (uVar16 - 0xb < 0xfffffff8) goto LAB_001a3798;
        uVar12 = (ulong)((uVar6 & 0x3fffffff) - 1);
        if (*(char *)((long)__s1 + uVar12) == 's') {
          uVar16 = uVar16 - 1;
          *(undefined1 *)((long)__s1 + uVar12) = 0;
        }
        computeJD(p);
        local_cc = 0;
        local_88 = (double)CONCAT44(uStack_8c,M);
        if (uVar16 - 3 < 4) {
          uStack_80 = 0;
          local_c8 = *(double *)(&DAT_001aa930 + (ulong)(local_88 < 0.0) * 8);
          switch(uVar16) {
          case 3:
            iVar5 = strcmp((char *)__s1,"day");
            if (iVar5 != 0) goto LAB_001a3606;
            local_88 = local_88 * 86400000.0;
            break;
          case 4:
            iVar5 = strcmp((char *)__s1,"hour");
            if (iVar5 != 0) {
              iVar5 = strcmp((char *)__s1,"year");
              if (iVar5 != 0) goto LAB_001a3606;
              iVar5 = (int)local_88;
              computeYMD(p);
              computeHMS(p);
              p->Y = p->Y + iVar5;
              p->validJD = '\0';
              computeJD(p);
              dVar4 = (double)(int)local_88;
              if ((local_88 != dVar4) || (NAN(local_88) || NAN(dVar4))) {
                dVar4 = (local_88 - dVar4) * 365.0;
                goto LAB_001a3775;
              }
              goto LAB_001a378c;
            }
            local_88 = local_88 * 3600000.0;
            break;
          case 5:
            iVar5 = strcmp((char *)__s1,"month");
            if (iVar5 != 0) goto LAB_001a3606;
            computeYMD(p);
            computeHMS(p);
            iVar17 = (int)local_88;
            iVar5 = p->M + iVar17;
            if (iVar5 == 0 || SCARRY4(p->M,iVar17) != iVar5 < 0) {
              uVar6 = -((0xcU - iVar5) / 0xc);
            }
            else {
              uVar6 = (iVar5 - 1U) / 0xc;
            }
            p->Y = p->Y + uVar6;
            p->M = iVar5 + uVar6 * -0xc;
            p->validJD = '\0';
            computeJD(p);
            dVar4 = (double)iVar17;
            if ((local_88 == dVar4) && (!NAN(local_88) && !NAN(dVar4))) goto LAB_001a378c;
            dVar4 = (local_88 - dVar4) * 30.0;
LAB_001a3775:
            local_88 = dVar4 * 86400000.0 + local_c8;
            goto LAB_001a3788;
          case 6:
            iVar5 = strcmp((char *)__s1,"minute");
            if (iVar5 == 0) {
              local_88 = local_88 * 60000.0;
            }
            else {
              iVar5 = strcmp((char *)__s1,"second");
              if (iVar5 != 0) goto LAB_001a3606;
              local_88 = local_88 * 1000.0;
            }
          }
          local_88 = local_88 + local_c8;
LAB_001a3788:
          p->iJD = p->iJD + (long)local_88;
        }
        else {
LAB_001a3606:
          local_cc = 1;
        }
LAB_001a378c:
        p->validYMD = '\0';
        p->validHMS = '\0';
        p->validTZ = '\0';
      }
LAB_001a3798:
      if (local_cc != 0) {
        return 1;
      }
    }
    else {
      if (0x74 < (Y & 0xffU)) {
        if (uVar6 == 0x75) {
          if ((CONCAT11((undefined1)iStack_af,local_b0) == 0x68 &&
               CONCAT44(uStack_b4,Y) == 0x636f706578696e75) && (p->validJD != '\0')) {
            p->iJD = (p->iJD + 0xa8c0) / 0x15180 + 0xbfc83e532200;
            p->validYMD = '\0';
            p->validHMS = '\0';
            p->validTZ = '\0';
            goto LAB_001a37a3;
          }
          if (Y == 0x637475) {
            computeJD(p);
            sVar8 = localtimeOffset(p,local_c0,&local_cc);
            if (local_cc != 0) {
              return 1;
            }
            p->iJD = p->iJD - sVar8;
            p->validYMD = '\0';
            p->validHMS = '\0';
            p->validTZ = '\0';
            sVar9 = localtimeOffset(p,local_c0,&local_cc);
            p->iJD = p->iJD + (sVar8 - sVar9);
          }
        }
        else if ((uVar6 == 0x77) && (CONCAT44(uStack_b4,Y) == 0x207961646b656577)) {
          uVar6 = 0xffffffff;
          pcVar11 = &local_b0;
          do {
            uVar6 = uVar6 + 1;
            cVar3 = *pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (cVar3 != '\0');
          iVar5 = sqlite3AtoF(&local_b0,(double *)&M,uVar6 & 0x3fffffff,'\x01');
          if (((iVar5 != 0) && (dVar4 = (double)CONCAT44(uStack_8c,M), dVar4 < 7.0)) &&
             (uVar6 = (uint)dVar4, -1 < (int)uVar6)) {
            if ((dVar4 == (double)(int)dVar4) && (!NAN(dVar4) && !NAN((double)(int)dVar4))) {
              computeYMD(p);
              computeHMS(p);
              p->validJD = '\0';
              p->validTZ = '\0';
              computeJD(p);
              lVar14 = (p->iJD + 0x7b98a00) / 86400000;
              lVar13 = (lVar14 / 7) * -7 + -7 + lVar14;
              if (lVar14 % 7 <= (long)(ulong)uVar6) {
                lVar13 = lVar14 % 7;
              }
              p->iJD = ((ulong)uVar6 - lVar13) * 86400000 + p->iJD;
              p->validYMD = '\0';
              p->validHMS = '\0';
              p->validTZ = '\0';
              goto LAB_001a37a3;
            }
          }
        }
        goto LAB_001a3798;
      }
      if (uVar6 == 0x6c) {
        if (CONCAT11((undefined1)iStack_af,local_b0) == 0x65 &&
            CONCAT44(uStack_b4,Y) == 0x6d69746c61636f6c) {
          computeJD(p);
          sVar8 = localtimeOffset(p,local_c0,&local_cc);
          p->iJD = p->iJD + sVar8;
          p->validYMD = '\0';
          p->validHMS = '\0';
          p->validTZ = '\0';
        }
        goto LAB_001a3798;
      }
      if ((uVar6 != 0x73) || (local_b0 != ' ' || CONCAT44(uStack_b4,Y) != 0x666f207472617473))
      goto LAB_001a3798;
      computeYMD(p);
      p->validHMS = '\x01';
      p->validJD = '\0';
      p->h = 0;
      p->m = 0;
      p->s = 0.0;
      p->validTZ = '\0';
      if (local_ab == 0x68 && iStack_af == 0x746e6f6d) {
        p->D = 1;
      }
      else if ((char)local_ab == '\0' && iStack_af == 0x72616579) {
        computeYMD(p);
        p->M = 1;
        p->D = 1;
      }
      else if (iStack_af != 0x796164) goto LAB_001a3798;
    }
LAB_001a37a3:
    uVar18 = uVar18 + 1;
    argv = local_78;
    if (uVar18 == local_70) {
      return 0;
    }
  } while( true );
}

Assistant:

static int isDate(
  sqlite3_context *context, 
  int argc, 
  sqlite3_value **argv, 
  DateTime *p
){
  int i;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    p->iJD = (sqlite3_int64)(sqlite3_value_double(argv[0])*86400000.0 + 0.5);
    p->validJD = 1;
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, p) ) return 1;
  }
  return 0;
}